

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_kr_loop_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
ted_k(TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      *this,TreeIndexAll *t1,TreeIndexAll *t2,int k)

{
  int t1_size_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference piVar5;
  const_reference pvVar6;
  double *pdVar7;
  double extraout_XMM0_Qa;
  int local_84;
  int e_max;
  int y_l;
  int x_l;
  int top_y;
  int top_x;
  int y;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<int,_std::allocator<int>_> *__range3;
  const_iterator cStack_50;
  int x;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  int t2_size;
  int t1_size;
  int k_local;
  TreeIndexAll *t2_local;
  TreeIndexAll *t1_local;
  TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  t1_size_00 = (t1->super_Constants).tree_size_;
  iVar1 = (t2->super_Constants).tree_size_;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
  init_matrices(&this->
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ,t1_size_00,k);
  (this->
  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>).
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
  subproblem_counter_ = 0;
  iVar3 = t1_size_00 - iVar1;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  if (k < iVar3) {
    this_local = (TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  *)std::numeric_limits<double>::infinity();
  }
  else {
    __end0 = std::vector<int,_std::allocator<int>_>::begin(&(t1->super_ListKR).list_kr_);
    cStack_50 = std::vector<int,_std::allocator<int>_>::end(&(t1->super_ListKR).list_kr_);
    while (bVar2 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb0), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      iVar3 = *piVar5;
      __end0_1 = std::vector<int,_std::allocator<int>_>::begin(&(t2->super_ListKR).list_kr_);
      _top_x = std::vector<int,_std::allocator<int>_>::end(&(t2->super_ListKR).list_kr_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end0_1,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)&top_x), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end0_1);
        iVar4 = *piVar5;
        x_l = -1;
        y_l = -1;
        e_max = iVar3;
        while (local_84 = iVar4, -1 < e_max) {
          while (y_l < local_84) {
            bVar2 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    ::k_relevant(&this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                 ,t1,t2,e_max,local_84,k);
            if (bVar2) {
              if (x_l == -1) {
                x_l = e_max;
              }
              y_l = local_84;
              break;
            }
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2->super_PostLToLCh).postl_to_lch_,(long)local_84);
            local_84 = *pvVar6;
          }
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t1->super_PostLToLCh).postl_to_lch_,(long)e_max);
          e_max = *pvVar6;
        }
        if ((-1 < x_l) && (-1 < y_l)) {
          iVar4 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ::e_budget(&this->
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ,t1,t2,x_l,y_l,k);
          (*(this->
            super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            ).
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
            _vptr_TEDAlgorithm[2])
                    (this,t1,t2,(ulong)(uint)x_l,(ulong)(uint)y_l,(ulong)(uint)k,iVar4);
          pdVar7 = data_structures::BandMatrix<double>::at
                             (&(this->
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).td_,(long)x_l,(long)y_l);
          *pdVar7 = extraout_XMM0_Qa;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end0_1);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    pdVar7 = data_structures::BandMatrix<double>::read_at
                       (&(this->
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).td_,(long)(t1_size_00 + -1),(long)(iVar1 + -1));
    this_local = (TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  *)*pdVar7;
  }
  return (double)this_local;
}

Assistant:

double TouzetKRLoopTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  
  const int t1_size = t1.tree_size_;
  const int t2_size = t2.tree_size_;

  init_matrices(t1_size, k);

  // Reset subproblem counter.
  subproblem_counter_ = 0;

  // If the pair of root nodes is not in k-strip (input tree size difference is
  // greater than k), return infinity.
  if (std::abs(t1_size - t2_size) > k) {
    return std::numeric_limits<double>::infinity();
  }
  
  // NOTE: There is an alternative approach to the kr-loop solution.
  //       Given kr pair, find top_x as in the current loop. Find top_y by
  //       swapping x and y parameters.
  //       The two solutions differ in the number of steps for the worst and
  //       best case.
  //       TODO: Verify empirically.
  
  // Iterate over all keyroot node pairs.
  for (auto x : t1.list_kr_) {
    for (auto y : t2.list_kr_) {
      int top_x = -1;
      int top_y = -1;
      // Search for top relevant pair.
      int x_l = x;
      while (x_l >= 0) { // We have to go through all x. Once we find a top_y,
                         // the consecutive x have to be checked against only
                         // y_l > top_y.
        int y_l = y;
        while (y_l > top_y) { // Verify only those nodes on the left
                              // path from y that are above the
                              // already found relevant node.
          if (k_relevant(t1, t2, x_l, y_l, k)) { // The pair has to be in the band
                                         // (std::abs(x_l - y_l) <= k satisfied
                                         // by the stronger k-relevancy)
                                         // and it has to be relevant.
            if (top_x == -1) top_x = x_l; // The first top_x found is maximal.
            top_y = y_l; // y_l always > top_y; std::max(top_y, y_l) not needed.
            break; // Don't continue down the path in the right-hand tree.
          }
          y_l = t2.postl_to_lch_[y_l];
        }
        x_l = t1.postl_to_lch_[x_l];
      }
      if (top_x > -1 && top_y > -1) {
        int e_max = e_budget(t1, t2, top_x, top_y, k);
        // Get max e over node pairs on left paths.
        // TODO: Whether to do it or not has to be evaluated. I don't remember
        //       but I think it is kind of an optimization if e_max can be
        //       smaller than k.
        // if (compute_e_max) {
          // e_max = 0;
          // int x_i = top_x;
          // while (x_i > -1) {
          //   int y_i = top_y;
          //   while (y_i > -1) {
          //     e_max = std::max(e_max, e_budget(t1, t2, x_i, y_i, k));
          //     y_i = t2.postl_to_lch_[y_i];
          //   }
          //   x_i = t1.postl_to_lch_[x_i];
          // }
        // }
        td_.at(top_x, top_y) = tree_dist(t1, t2, top_x, top_y, k, e_max);
      }
    }
  }
  return td_.read_at(t1_size-1, t2_size-1);
}